

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

xmlChar * xmlBuildRelativeURI(xmlChar *URI,xmlChar *base)

{
  xmlChar xVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  xmlURIPtr uri;
  xmlChar *pxVar5;
  xmlURIPtr uri_00;
  xmlChar *pxVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  xmlChar *pxVar12;
  xmlChar *__dest;
  
  if ((URI == (xmlChar *)0x0) || (*URI == '\0')) {
    return (xmlChar *)0x0;
  }
  uri = (xmlURIPtr)(*xmlMalloc)(0x58);
  if (uri == (xmlURIPtr)0x0) {
    xmlURIErrMemory("creating URI structure\n");
    return (xmlChar *)0x0;
  }
  uri->fragment = (char *)0x0;
  *(undefined8 *)&uri->cleanup = 0;
  uri->path = (char *)0x0;
  uri->query = (char *)0x0;
  uri->user = (char *)0x0;
  *(undefined8 *)&uri->port = 0;
  uri->authority = (char *)0x0;
  uri->server = (char *)0x0;
  uri->scheme = (char *)0x0;
  uri->opaque = (char *)0x0;
  uri->query_raw = (char *)0x0;
  if (*URI != '.') {
    iVar3 = xmlParse3986URIReference(uri,(char *)URI);
    if (iVar3 == 0) goto LAB_0018bf79;
LAB_0018bfe2:
    pxVar5 = (xmlChar *)0x0;
    goto LAB_0018bfe8;
  }
  pxVar5 = xmlStrdup(URI);
  uri->path = (char *)pxVar5;
LAB_0018bf79:
  if ((base == (xmlChar *)0x0) || (*base == '\0')) {
    pxVar5 = xmlStrdup(URI);
    goto LAB_0018bfe8;
  }
  uri_00 = (xmlURIPtr)(*xmlMalloc)(0x58);
  if (uri_00 == (xmlURIPtr)0x0) {
    xmlURIErrMemory("creating URI structure\n");
    goto LAB_0018bfe2;
  }
  uri_00->fragment = (char *)0x0;
  *(undefined8 *)&uri_00->cleanup = 0;
  uri_00->path = (char *)0x0;
  uri_00->query = (char *)0x0;
  uri_00->user = (char *)0x0;
  *(undefined8 *)&uri_00->port = 0;
  uri_00->authority = (char *)0x0;
  uri_00->server = (char *)0x0;
  uri_00->scheme = (char *)0x0;
  uri_00->opaque = (char *)0x0;
  uri_00->query_raw = (char *)0x0;
  if (*base == '.') {
    pxVar5 = xmlStrdup(base);
    uri_00->path = (char *)pxVar5;
LAB_0018c016:
    if (((xmlChar *)uri->scheme == (xmlChar *)0x0) ||
       ((((xmlChar *)uri_00->scheme != (xmlChar *)0x0 &&
         (iVar3 = xmlStrcmp((xmlChar *)uri_00->scheme,(xmlChar *)uri->scheme), iVar3 == 0)) &&
        (iVar3 = xmlStrcmp((xmlChar *)uri_00->server,(xmlChar *)uri->server), iVar3 == 0)))) {
      iVar3 = xmlStrEqual((xmlChar *)uri_00->path,(xmlChar *)uri->path);
      if (iVar3 == 0) {
        pcVar11 = uri_00->path;
        URI = (xmlChar *)uri->path;
        if (pcVar11 != (char *)0x0) {
          pxVar5 = URI;
          if (URI == (xmlChar *)0x0) {
            pxVar5 = "/";
            uri->path = "/";
            pcVar11 = uri_00->path;
          }
          if (*pxVar5 == '.') {
            pxVar5 = pxVar5 + (ulong)(pxVar5[1] == '/') * 2;
          }
          if (*pcVar11 == '/') {
            pcVar11 = pcVar11 + (*pxVar5 != '/');
          }
          else if (*pcVar11 == '.') {
            pcVar11 = pcVar11 + (ulong)(pcVar11[1] == '/') * 2;
          }
          uVar7 = 0;
          do {
            xVar1 = pcVar11[uVar7];
            pxVar6 = pxVar5 + uVar7;
            uVar7 = uVar7 + 1;
            if (xVar1 == '\0') break;
          } while (xVar1 == *pxVar6);
          if (xVar1 != *pxVar6) {
            iVar3 = 0;
            do {
              uVar8 = uVar7 - 1;
              if ((long)uVar8 < 1) goto LAB_0018c127;
              lVar2 = uVar7 - 2;
              uVar7 = uVar8;
            } while (pxVar5[lVar2] != '/');
            iVar3 = (int)uVar8;
LAB_0018c127:
            uVar7 = 0;
            if ((long)uVar8 < 1) {
              uVar8 = uVar7;
            }
            pcVar11 = pcVar11 + (int)uVar8;
            do {
              iVar9 = (int)uVar7;
              if (*pcVar11 == '/') {
                uVar7 = (ulong)(iVar9 + 1);
              }
              else if (*pcVar11 == '\0') goto LAB_0018c14e;
              pcVar11 = pcVar11 + 1;
            } while( true );
          }
          pcVar11 = "";
          goto LAB_0018c101;
        }
      }
      else {
        URI = "";
      }
    }
    pxVar5 = xmlStrdup(URI);
  }
  else {
    iVar3 = xmlParse3986URIReference(uri_00,(char *)base);
    if (iVar3 == 0) goto LAB_0018c016;
    pxVar5 = (xmlChar *)0x0;
  }
LAB_0018c0c3:
  xmlFreeURI(uri);
  uri = uri_00;
LAB_0018bfe8:
  xmlFreeURI(uri);
  return pxVar5;
LAB_0018c14e:
  pxVar5 = pxVar5 + iVar3;
  if (iVar9 == 0) {
    if (*pxVar5 != '\0') {
      xmlStrlen(pxVar5);
      pxVar5 = xmlURIEscapeStr(pxVar5,(xmlChar *)"/;&=+$,");
      goto LAB_0018c25c;
    }
    pcVar11 = "./";
LAB_0018c101:
    pxVar5 = xmlStrdup((xmlChar *)pcVar11);
  }
  else {
    uVar4 = xmlStrlen(pxVar5);
    pxVar6 = (xmlChar *)(*xmlMalloc)((long)(int)(uVar4 + iVar9 * 3 + 1));
    if (pxVar6 == (xmlChar *)0x0) {
      xmlURIErrMemory("building relative URI\n");
      pxVar5 = (xmlChar *)0x0;
    }
    else {
      __dest = pxVar6;
      if (iVar9 < 1) {
LAB_0018c21d:
        memcpy(__dest,pxVar5,(long)(int)(uVar4 + 1));
      }
      else {
        uVar10 = iVar9 + 1;
        do {
          pxVar12 = __dest;
          pxVar12[0] = '.';
          pxVar12[1] = '.';
          pxVar12[2] = '/';
          __dest = pxVar12 + 3;
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
        if ((((int)uVar4 < 0) || (__dest <= pxVar6)) || ((*pxVar5 != '/' || (pxVar12[2] != '/'))))
        goto LAB_0018c21d;
        memcpy(__dest,pxVar5 + 1,(ulong)uVar4);
        uVar4 = uVar4 - 1;
      }
      __dest[(int)uVar4] = '\0';
      pxVar5 = xmlURIEscapeStr(pxVar6,(xmlChar *)"/;&=+$,");
      (*xmlFree)(pxVar6);
    }
  }
LAB_0018c25c:
  if (URI == (xmlChar *)0x0) {
    uri->path = (char *)0x0;
  }
  goto LAB_0018c0c3;
}

Assistant:

xmlChar *
xmlBuildRelativeURI (const xmlChar * URI, const xmlChar * base)
{
    xmlChar *val = NULL;
    int ret;
    int ix;
    int nbslash = 0;
    int len;
    xmlURIPtr ref = NULL;
    xmlURIPtr bas = NULL;
    xmlChar *bptr, *uptr, *vptr;
    int remove_path = 0;

    if ((URI == NULL) || (*URI == 0))
	return NULL;

    /*
     * First parse URI into a standard form
     */
    ref = xmlCreateURI ();
    if (ref == NULL)
	return NULL;
    /* If URI not already in "relative" form */
    if (URI[0] != '.') {
	ret = xmlParseURIReference (ref, (const char *) URI);
	if (ret != 0)
	    goto done;		/* Error in URI, return NULL */
    } else
	ref->path = (char *)xmlStrdup(URI);

    /*
     * Next parse base into the same standard form
     */
    if ((base == NULL) || (*base == 0)) {
	val = xmlStrdup (URI);
	goto done;
    }
    bas = xmlCreateURI ();
    if (bas == NULL)
	goto done;
    if (base[0] != '.') {
	ret = xmlParseURIReference (bas, (const char *) base);
	if (ret != 0)
	    goto done;		/* Error in base, return NULL */
    } else
	bas->path = (char *)xmlStrdup(base);

    /*
     * If the scheme / server on the URI differs from the base,
     * just return the URI
     */
    if ((ref->scheme != NULL) &&
	((bas->scheme == NULL) ||
	 (xmlStrcmp ((xmlChar *)bas->scheme, (xmlChar *)ref->scheme)) ||
	 (xmlStrcmp ((xmlChar *)bas->server, (xmlChar *)ref->server)))) {
	val = xmlStrdup (URI);
	goto done;
    }
    if (xmlStrEqual((xmlChar *)bas->path, (xmlChar *)ref->path)) {
	val = xmlStrdup(BAD_CAST "");
	goto done;
    }
    if (bas->path == NULL) {
	val = xmlStrdup((xmlChar *)ref->path);
	goto done;
    }
    if (ref->path == NULL) {
        ref->path = (char *) "/";
	remove_path = 1;
    }

    /*
     * At this point (at last!) we can compare the two paths
     *
     * First we take care of the special case where either of the
     * two path components may be missing (bug 316224)
     */
    bptr = (xmlChar *)bas->path;
    {
        xmlChar *rptr = (xmlChar *) ref->path;
        int pos = 0;

        /*
         * Next we compare the two strings and find where they first differ
         */
	if ((*rptr == '.') && (rptr[1] == '/'))
            rptr += 2;
	if ((*bptr == '.') && (bptr[1] == '/'))
            bptr += 2;
	else if ((*bptr == '/') && (*rptr != '/'))
	    bptr++;
	while ((bptr[pos] == rptr[pos]) && (bptr[pos] != 0))
	    pos++;

	if (bptr[pos] == rptr[pos]) {
	    val = xmlStrdup(BAD_CAST "");
	    goto done;		/* (I can't imagine why anyone would do this) */
	}

	/*
	 * In URI, "back up" to the last '/' encountered.  This will be the
	 * beginning of the "unique" suffix of URI
	 */
	ix = pos;
	for (; ix > 0; ix--) {
	    if (rptr[ix - 1] == '/')
		break;
	}
	uptr = (xmlChar *)&rptr[ix];

	/*
	 * In base, count the number of '/' from the differing point
	 */
	for (; bptr[ix] != 0; ix++) {
	    if (bptr[ix] == '/')
		nbslash++;
	}

	/*
	 * e.g: URI="foo/" base="foo/bar" -> "./"
	 */
	if (nbslash == 0 && !uptr[0]) {
	    val = xmlStrdup(BAD_CAST "./");
	    goto done;
	}

	len = xmlStrlen (uptr) + 1;
    }

    if (nbslash == 0) {
	if (uptr != NULL)
	    /* exception characters from xmlSaveUri */
	    val = xmlURIEscapeStr(uptr, BAD_CAST "/;&=+$,");
	goto done;
    }

    /*
     * Allocate just enough space for the returned string -
     * length of the remainder of the URI, plus enough space
     * for the "../" groups, plus one for the terminator
     */
    val = (xmlChar *) xmlMalloc (len + 3 * nbslash);
    if (val == NULL) {
        xmlURIErrMemory("building relative URI\n");
	goto done;
    }
    vptr = val;
    /*
     * Put in as many "../" as needed
     */
    for (; nbslash>0; nbslash--) {
	*vptr++ = '.';
	*vptr++ = '.';
	*vptr++ = '/';
    }
    /*
     * Finish up with the end of the URI
     */
    if (uptr != NULL) {
        if ((vptr > val) && (len > 0) &&
	    (uptr[0] == '/') && (vptr[-1] == '/')) {
	    memcpy (vptr, uptr + 1, len - 1);
	    vptr[len - 2] = 0;
	} else {
	    memcpy (vptr, uptr, len);
	    vptr[len - 1] = 0;
	}
    } else {
	vptr[len - 1] = 0;
    }

    /* escape the freshly-built path */
    vptr = val;
	/* exception characters from xmlSaveUri */
    val = xmlURIEscapeStr(vptr, BAD_CAST "/;&=+$,");
    xmlFree(vptr);

done:
    /*
     * Free the working variables
     */
    if (remove_path != 0)
        ref->path = NULL;
    if (ref != NULL)
	xmlFreeURI (ref);
    if (bas != NULL)
	xmlFreeURI (bas);

    return val;
}